

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

void __thiscall webrtc::Histogram::~Histogram(Histogram *this)

{
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&this->hist_bin_index_);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&this->activity_probability_);
  return;
}

Assistant:

Histogram::~Histogram() {}